

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
PluginManagerTest_PluginName_Test::~PluginManagerTest_PluginName_Test
          (PluginManagerTest_PluginName_Test *this)

{
  PluginManagerTest_PluginName_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST( PluginManagerTest, PluginName )
{
	char pluginName[20];
	if ( IPluginManager::Get()->loadPlugin( "pluginA" ) )
	{
		auto plugin = IPluginManager::Get()->getPlugin( "pluginA" );
		strcpy( pluginName, plugin->name() );
		IPluginManager::Get()->unloadPlugin( "pluginA" );
	}

	EXPECT_STREQ( "PluginA", pluginName );
}